

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  xmlNodePtr cur;
  int iVar1;
  int iVar2;
  int iVar3;
  xmlDocPtr doc;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  stat buf;
  stat64 sStack_2b8;
  char local_228 [504];
  
  logfile = (FILE *)fopen64("runxmlconf.log","wb");
  if ((FILE *)logfile == (FILE *)0x0) {
    main_cold_1();
  }
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  ctxtXPath = (xmlXPathContextPtr_conflict)xmlXPathNewContext(0);
  if (ctxtXPath->cache != (void *)0x0) {
    xmlXPathContextSetCache(ctxtXPath,0,0xffffffff,0);
  }
  pcVar8 = "xmlconf";
  if (1 < argc) {
    iVar7 = 1;
    do {
      __s1 = argv[iVar7];
      iVar2 = strcmp(__s1,"-v");
      if (iVar2 == 0) {
        verbose = 1;
      }
      else {
        iVar2 = strcmp(__s1,"-d");
        if ((iVar2 != 0) || (iVar7 = iVar7 + 1, argc <= iVar7)) {
          fprintf(_stderr,"invalid argument: %s\n",__s1);
          return 1;
        }
        pcVar8 = argv[iVar7];
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < argc);
  }
  iVar1 = nb_leaks;
  iVar2 = nb_tests;
  iVar7 = nb_errors;
  snprintf(local_228,500,"%s/xmlconf.xml",pcVar8);
  iVar3 = stat64(local_228,&sStack_2b8);
  if ((iVar3 == -1) || ((sStack_2b8.st_mode & 0xf000) != 0x8000)) {
    main_cold_5();
  }
  else {
    doc = (xmlDocPtr)xmlReadFile(local_228,0,2);
    if (doc == (xmlDocPtr)0x0) {
      main_cold_4();
    }
    else {
      lVar4 = xmlDocGetRootElement(doc);
      if ((lVar4 == 0) ||
         (iVar3 = xmlStrEqual(*(undefined8 *)(lVar4 + 0x10),"TESTSUITE"), iVar3 == 0)) {
        main_cold_3();
      }
      else {
        lVar5 = xmlGetProp(lVar4,"PROFILE");
        if (lVar5 == 0) {
          puts("Test suite");
        }
        else {
          printf("Test suite: %s\n",lVar5);
          (*_xmlFree)(lVar5);
        }
        for (cur = *(xmlNodePtr *)(lVar4 + 0x18); cur != (xmlNodePtr)0x0; cur = cur->next) {
          if (cur->type == XML_ELEMENT_NODE) {
            iVar3 = xmlStrEqual(cur->name,"TESTCASES");
            if (iVar3 == 0) {
              main_cold_2();
            }
            else {
              xmlconfTestCases(doc,cur,1);
            }
          }
        }
      }
      xmlFreeDoc(doc);
    }
  }
  if (nb_leaks == iVar1 && nb_errors == iVar7) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2),
           (ulong)(uint)(nb_errors - iVar7),(ulong)(uint)(nb_leaks - iVar1));
  }
  uVar6 = (ulong)(uint)nb_tests;
  if (nb_errors == 0 && nb_leaks == 0) {
    pcVar8 = "Total %d tests, no errors\n";
  }
  else {
    printf("Total %d tests, %d errors, %d leaks\n",uVar6);
    printf("See %s for detailed output\n","runxmlconf.log");
    iVar7 = 1;
    if ((nb_leaks != 0) || (nb_errors != 0xf)) goto LAB_001027ae;
    pcVar8 = "%d errors were expected\n";
    uVar6 = 0xf;
  }
  iVar7 = 0;
  printf(pcVar8,uVar6);
LAB_001027ae:
  xmlXPathFreeContext(ctxtXPath);
  xmlCleanupParser();
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
  }
  return iVar7;
}

Assistant:

int
main(int argc, char **argv) {
    int ret = 0;
    int old_errors, old_tests, old_leaks;
    const char *dir = "xmlconf";
    int i;

    logfile = fopen(LOGFILE, "wb");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    for (i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-v") == 0) {
            verbose = 1;
        } else if (strcmp(argv[i], "-d") == 0 && i + 1 < argc) {
            i += 1;
            dir = argv[i];
        } else {
            fprintf(stderr, "invalid argument: %s\n", argv[i]);
            return 1;
        }
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xmlconfTest(dir);
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
	ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
	printf("See %s for detailed output\n", LOGFILE);
	if ((nb_leaks == 0) && (nb_errors == NB_EXPECTED_ERRORS)) {
	    printf("%d errors were expected\n", nb_errors);
	    ret = 0;
	}
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}